

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_false>::parse_eol
                   (char_t *s,char_t end_quote)

{
  char_t *pcVar1;
  byte *pbVar2;
  undefined1 local_30 [8];
  gap g;
  byte *pbStack_18;
  char_t end_quote_local;
  char_t *s_local;
  
  g.size._7_1_ = end_quote;
  pbStack_18 = (byte *)s;
  gap::gap((gap *)local_30);
  while( true ) {
    while (((anonymous_namespace)::chartype_table[*pbStack_18] & 2) == 0) {
      pbStack_18 = pbStack_18 + 1;
    }
    if (*pbStack_18 == g.size._7_1_) break;
    if (*pbStack_18 == 0xd) {
      pbVar2 = pbStack_18 + 1;
      *pbStack_18 = 10;
      pbStack_18 = pbVar2;
      if (*pbVar2 == 10) {
        gap::push((gap *)local_30,(char_t **)&stack0xffffffffffffffe8,1);
      }
    }
    else {
      if (*pbStack_18 == 0) {
        return (char_t *)0x0;
      }
      pbStack_18 = pbStack_18 + 1;
    }
  }
  pcVar1 = gap::flush((gap *)local_30,(char_t *)pbStack_18);
  *pcVar1 = '\0';
  return (char_t *)(pbStack_18 + 1);
}

Assistant:

static char_t* parse_eol(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				while (!PUGI__IS_CHARTYPE(*s, ct_parse_attr)) ++s;
				
				if (*s == end_quote)
				{
					*g.flush(s) = 0;
				
					return s + 1;
				}
				else if (*s == '\r')
				{
					*s++ = '\n';
					
					if (*s == '\n') g.push(s, 1);
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return 0;
				}
				else ++s;
			}
		}